

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

boolean jpeg_finish_output(j_decompress_ptr cinfo)

{
  int iVar1;
  long *in_RDI;
  bool bVar2;
  
  if (((*(int *)((long)in_RDI + 0x24) == 0xcd) || (*(int *)((long)in_RDI + 0x24) == 0xce)) &&
     ((int)in_RDI[0xb] != 0)) {
    (**(code **)(in_RDI[0x44] + 8))(in_RDI);
    *(undefined4 *)((long)in_RDI + 0x24) = 0xd0;
  }
  else if (*(int *)((long)in_RDI + 0x24) != 0xd0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  while( true ) {
    bVar2 = false;
    if (*(int *)((long)in_RDI + 0xac) <= *(int *)((long)in_RDI + 0xb4)) {
      bVar2 = *(int *)(in_RDI[0x48] + 0x24) == 0;
    }
    if (!bVar2) break;
    iVar1 = (**(code **)in_RDI[0x48])(in_RDI);
    if (iVar1 == 0) {
      return 0;
    }
  }
  *(undefined4 *)((long)in_RDI + 0x24) = 0xcf;
  return 1;
}

Assistant:

GLOBAL(boolean)
jpeg_finish_output(j_decompress_ptr cinfo)
{
  if ((cinfo->global_state == DSTATE_SCANNING ||
       cinfo->global_state == DSTATE_RAW_OK) && cinfo->buffered_image) {
    /* Terminate this pass. */
    /* We do not require the whole pass to have been completed. */
    (*cinfo->master->finish_output_pass) (cinfo);
    cinfo->global_state = DSTATE_BUFPOST;
  } else if (cinfo->global_state != DSTATE_BUFPOST) {
    /* BUFPOST = repeat call after a suspension, anything else is error */
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  /* Read markers looking for SOS or EOI */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
         !cinfo->inputctl->eoi_reached) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return FALSE;             /* Suspend, come back later */
  }
  cinfo->global_state = DSTATE_BUFIMAGE;
  return TRUE;
}